

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTSoundBank_GetNumCues(FACTSoundBank *pSoundBank,uint16_t *pnNumCues)

{
  undefined2 *in_RSI;
  long in_RDI;
  
  if (in_RDI == 0) {
    *in_RSI = 0;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x11405c);
    *in_RSI = *(undefined2 *)(in_RDI + 0x20);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x114080);
  }
  return 0;
}

Assistant:

uint32_t FACTSoundBank_GetNumCues(
	FACTSoundBank *pSoundBank,
	uint16_t *pnNumCues
) {
	if (pSoundBank == NULL)
	{
		*pnNumCues = 0;
		return 0;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
	*pnNumCues = pSoundBank->cueCount;
	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}